

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_context_uninit__alsa(ma_context *pContext)

{
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3f23,"ma_result ma_context_uninit__alsa(ma_context *)");
  }
  if (pContext->backend == ma_backend_alsa) {
    (*(pContext->field_14).alsa.snd_config_update_free_global)();
    dlclose((pContext->field_14).alsa.asoundSO);
    pthread_mutex_destroy((pthread_mutex_t *)((long)&pContext->field_14 + 0x218));
    return MA_SUCCESS;
  }
  __assert_fail("pContext->backend == ma_backend_alsa",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x3f24,"ma_result ma_context_uninit__alsa(ma_context *)");
}

Assistant:

static ma_result ma_context_uninit__alsa(ma_context* pContext)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pContext->backend == ma_backend_alsa);

    /* Clean up memory for memory leak checkers. */
    ((ma_snd_config_update_free_global_proc)pContext->alsa.snd_config_update_free_global)();

#ifndef MA_NO_RUNTIME_LINKING
    ma_dlclose(pContext, pContext->alsa.asoundSO);
#endif

    ma_mutex_uninit(&pContext->alsa.internalDeviceEnumLock);

    return MA_SUCCESS;
}